

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

int JsUtil::
    BaseDictionary<Js::RecyclableObject_*,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::GetNextFreeEntryIndex(EntryType *freeEntry)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  int iVar4;
  
  iVar4 = (freeEntry->
          super_DefaultHashedEntry<Js::RecyclableObject_*,_unsigned_long,_JsUtil::(anonymous_namespace)::KeyValueEntry>
          ).super_KeyValueEntry<Js::RecyclableObject_*,_unsigned_long>.
          super_ValueEntry<unsigned_long,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::RecyclableObject_*,_unsigned_long>_>
          .super_KeyValueEntryDataLayout2<Js::RecyclableObject_*,_unsigned_long>.next;
  if (-2 < iVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                       ,0x32a,"(IsFreeEntry(freeEntry))","IsFreeEntry(freeEntry)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    iVar4 = (freeEntry->
            super_DefaultHashedEntry<Js::RecyclableObject_*,_unsigned_long,_JsUtil::(anonymous_namespace)::KeyValueEntry>
            ).super_KeyValueEntry<Js::RecyclableObject_*,_unsigned_long>.
            super_ValueEntry<unsigned_long,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::RecyclableObject_*,_unsigned_long>_>
            .super_KeyValueEntryDataLayout2<Js::RecyclableObject_*,_unsigned_long>.next;
  }
  return -2 - iVar4;
}

Assistant:

static int GetNextFreeEntryIndex(const EntryType &freeEntry)
        {
            Assert(IsFreeEntry(freeEntry));
            return FreeListSentinel - freeEntry.next;
        }